

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O1

void __thiscall
AppParametersTest_multiword_value_eq_Test::TestBody(AppParametersTest_multiword_value_eq_Test *this)

{
  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_> uVar1;
  byte bVar2;
  long lVar3;
  long *plVar4;
  object *poVar5;
  _Uninitialized<void_*,_true> _Var6;
  char *pcVar7;
  pointer *__ptr;
  bool bVar8;
  initializer_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>
  __l_00;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  expected_values;
  object obj;
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  expected_args;
  ArgWrapper<char> args;
  app_parameters parameters;
  long *local_2a0;
  less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  local_298 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  undefined1 local_288 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_280;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  local_278;
  _Variadic_union<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_268;
  _Rb_tree<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  local_228;
  undefined1 local_1f8 [72];
  AssertHelper local_1b0 [8];
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_1a8;
  ArgWrapper<char> local_190;
  app_parameters local_170 [336];
  
  ArgWrapper<char>::ArgWrapper<char_const*,char_const*,char_const*>
            (&local_190,"/path/to/exe","-key=valuePart1","valuePart2");
  uVar1._M_t.super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
  super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
  super__Head_base<0UL,_const_char_**,_false>._M_head_impl =
       local_190.m_argv._M_t.
       super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
       super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
       super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
  jessilib::app_parameters::default_stop_args();
  jessilib::app_parameters::app_parameters
            (local_170,
             (int)((ulong)((long)local_190.m_args.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_190.m_args.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 5),
             (char **)uVar1._M_t.
                      super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t
                      .super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                      super__Head_base<0UL,_const_char_**,_false>._M_head_impl,(char **)0x0,
             (unordered_set *)local_288);
  std::
  _Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_288);
  lVar3 = jessilib::app_parameters::name_abi_cxx11_();
  bVar8 = *(long *)(lVar3 + 8) != 0;
  local_1f8[0] = bVar8;
  local_1f8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar8) {
    testing::Message::Message((Message *)&local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_288,local_1f8,"parameters.name().empty()","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xde,(char *)local_288);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
    if (local_288 != (undefined1  [8])&local_278) {
      operator_delete((void *)local_288,local_278._M_allocated_capacity + 1);
    }
    if ((long *)local_228._M_impl._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_228._M_impl._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_1f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1f8._8_8_);
  }
  plVar4 = (long *)jessilib::app_parameters::arguments_abi_cxx11_();
  local_1f8._0_8_ = plVar4[1] - *plVar4 >> 5;
  local_228._M_impl._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_288,"parameters.arguments().size()","2U",(unsigned_long *)local_1f8,
             (uint *)&local_228);
  if (local_288[0] == (unordered_set)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_280._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_280._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xdf,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_228,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_228);
    if ((void *)local_1f8._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_1f8._0_8_ + 8))();
    }
  }
  if (local_280._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_280,local_280._M_head_impl);
  }
  plVar4 = (long *)jessilib::app_parameters::switches();
  local_1f8._0_8_ = plVar4[1] - *plVar4 >> 4;
  local_228._M_impl._0_8_ = local_228._M_impl._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_288,"parameters.switches().size()","0U",(unsigned_long *)local_1f8,
             (uint *)&local_228);
  if (local_288[0] == (unordered_set)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_280._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_280._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xe0,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_228,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_228);
    if ((void *)local_1f8._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_1f8._0_8_ + 8))();
    }
  }
  if (local_280._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_280,local_280._M_head_impl);
  }
  lVar3 = jessilib::app_parameters::switches_set();
  local_1f8._0_8_ = *(undefined8 *)(lVar3 + 0x18);
  local_228._M_impl._0_8_ = local_228._M_impl._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_288,"parameters.switches_set().size()","0U",
             (unsigned_long *)local_1f8,(uint *)&local_228);
  if (local_288[0] == (unordered_set)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_280._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_280._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xe1,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_228,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_228);
    if ((void *)local_1f8._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_1f8._0_8_ + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_280._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_280,local_280._M_head_impl);
  }
  jessilib::app_parameters::values();
  local_228._M_impl._0_8_ = local_278._8_8_;
  local_1a8.
  super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_1f8,"parameters.values().size()","1U",(unsigned_long *)&local_228,
             (uint *)&local_1a8);
  std::
  _Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_288);
  if ((bool)local_1f8[0] == false) {
    testing::Message::Message((Message *)local_288);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_1f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xe2,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_228,(Message *)local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_228);
    if (local_288 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_288 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_1f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1f8._8_8_);
  }
  jessilib::app_parameters::as_object();
  local_288 = (undefined1  [8])&local_278;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)local_288,"-key=valuePart1","");
  _Var6._M_storage = (void *)((long)&local_268 + 0x10);
  local_268._M_first._M_storage = (_Uninitialized<void_*,_true>)_Var6._M_storage;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)&local_268,"valuePart2","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_288;
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::vector(&local_1a8,__l,(allocator_type *)&local_228);
  lVar3 = -0x40;
  do {
    if ((long *)_Var6._M_storage != *(long **)((long)_Var6._M_storage + -0x10)) {
      operator_delete(*(long **)((long)_Var6._M_storage + -0x10),*_Var6._M_storage + 1);
    }
    _Var6._M_storage = _Var6._M_storage + -0x20;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  std::
  pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
  ::pair<const_char8_t_(&)[4],_const_char8_t_(&)[22],_true>
            ((pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
              *)local_288,(char8_t (*) [4])0x484937,(char8_t (*) [22])"valuePart1 valuePart2");
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_288;
  std::
  map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  ::map((map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
         *)&local_228,__l_00,local_298,(allocator_type *)&local_2a0);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_268._M_first);
  if (local_288 != (undefined1  [8])&local_278) {
    operator_delete((void *)local_288,local_278._M_allocated_capacity + 1);
  }
  bVar2 = jessilib::object::null();
  local_298[0] = (less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
                  )(bVar2 ^ 1);
  local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 != 0) {
    testing::Message::Message((Message *)&local_2a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_288,(char *)local_298,"obj.null()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xe7,(char *)local_288);
    testing::internal::AssertHelper::operator=(local_1b0,(Message *)&local_2a0);
    testing::internal::AssertHelper::~AssertHelper(local_1b0);
    if (local_288 != (undefined1  [8])&local_278) {
      operator_delete((void *)local_288,local_278._M_allocated_capacity + 1);
    }
    if (local_2a0 != (long *)0x0) {
      (**(code **)(*local_2a0 + 8))();
    }
  }
  if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_290,local_290);
  }
  local_288 = (undefined1  [8])&local_278;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)local_288,"Name","");
  poVar5 = (object *)jessilib::object::operator[]((u8string *)local_1f8);
  testing::internal::CmpHelperEQ<jessilib::object,char8_t[13]>
            ((internal *)local_298,"obj[u8\"Name\"]","u8\"/path/to/exe\"",poVar5,
             (char8_t (*) [13])"/path/to/exe");
  if (local_288 != (undefined1  [8])&local_278) {
    operator_delete((void *)local_288,local_278._M_allocated_capacity + 1);
  }
  if (local_298[0] ==
      (less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
       )0x0) {
    testing::Message::Message((Message *)local_288);
    if (local_290 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_290->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xe8,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    if (local_288 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_288 + 8))();
    }
  }
  if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_290,local_290);
  }
  local_288 = (undefined1  [8])&local_278;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)local_288,"Args","");
  poVar5 = (object *)jessilib::object::operator[]((u8string *)local_1f8);
  testing::internal::
  CmpHelperEQ<jessilib::object,std::vector<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>>
            ((internal *)local_298,"obj[u8\"Args\"]","expected_args",poVar5,&local_1a8);
  if (local_288 != (undefined1  [8])&local_278) {
    operator_delete((void *)local_288,local_278._M_allocated_capacity + 1);
  }
  if (local_298[0] ==
      (less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
       )0x0) {
    testing::Message::Message((Message *)local_288);
    if (local_290 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_290->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xe9,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    if (local_288 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_288 + 8))();
    }
  }
  if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_290,local_290);
  }
  local_288 = (undefined1  [8])&local_278;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)local_288,"Values","");
  poVar5 = (object *)jessilib::object::operator[]((u8string *)local_1f8);
  testing::internal::
  CmpHelperEQ<jessilib::object,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
            ((internal *)local_298,"obj[u8\"Values\"]","expected_values",poVar5,
             (map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
              *)&local_228);
  if (local_288 != (undefined1  [8])&local_278) {
    operator_delete((void *)local_288,local_278._M_allocated_capacity + 1);
  }
  if (local_298[0] ==
      (less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
       )0x0) {
    testing::Message::Message((Message *)local_288);
    if (local_290 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_290->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xea,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    if (local_288 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_288 + 8))();
    }
  }
  if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_290,local_290);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  ::~_Rb_tree(&local_228);
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~vector(&local_1a8);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)local_1f8);
  jessilib::app_parameters::~app_parameters(local_170);
  if ((_Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>)
      local_190.m_argv._M_t.
      super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
      super__Head_base<0UL,_const_char_**,_false>._M_head_impl != (char **)0x0) {
    operator_delete__((void *)local_190.m_argv._M_t.
                              super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>
                              .super__Head_base<0UL,_const_char_**,_false>._M_head_impl);
  }
  local_190.m_argv._M_t.super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>.
  _M_t.super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
  super__Head_base<0UL,_const_char_**,_false>._M_head_impl =
       (__uniq_ptr_data<const_char_*,_std::default_delete<const_char_*[]>,_true,_true>)
       (__uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_190.m_args);
  return;
}

Assistant:

TEST(AppParametersTest, multiword_value_eq) {
	ArgWrapper args{ "/path/to/exe", "-key=valuePart1", "valuePart2" };
	app_parameters parameters{ args.argc(), args.argv() };

	EXPECT_FALSE(parameters.name().empty());
	EXPECT_EQ(parameters.arguments().size(), 2U);
	EXPECT_EQ(parameters.switches().size(), 0U);
	EXPECT_EQ(parameters.switches_set().size(), 0U);
	EXPECT_EQ(parameters.values().size(), 1U);

	auto obj = parameters.as_object();
	std::vector<std::u8string> expected_args{ u8"-key=valuePart1", u8"valuePart2" };
	std::map<std::u8string, object> expected_values{ { u8"key", u8"valuePart1 valuePart2" } };
	EXPECT_FALSE(obj.null());
	EXPECT_EQ(obj[u8"Name"], u8"/path/to/exe");
	EXPECT_EQ(obj[u8"Args"], expected_args);
	EXPECT_EQ(obj[u8"Values"], expected_values);
}